

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::term(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_40 [32];
  __shared_ptr<BinaryOperator,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  factor(this);
  bVar1 = match(in_RSI,Plus);
  if (bVar1) {
    consume(in_RSI);
    std::make_shared<Addition>();
    term((Parser *)local_40);
    std::
    make_shared<BinaryOperator,std::shared_ptr<Addition>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
              ((shared_ptr<Addition> *)&local_20,(shared_ptr<Expression> *)(local_40 + 0x10),
               (shared_ptr<Expression> *)this);
  }
  else {
    bVar1 = match(in_RSI,Minus);
    _Var2._M_pi = extraout_RDX;
    if (!bVar1) goto LAB_0010db29;
    consume(in_RSI);
    std::make_shared<Subtraction>();
    term((Parser *)local_40);
    std::
    make_shared<BinaryOperator,std::shared_ptr<Subtraction>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
              ((shared_ptr<Subtraction> *)&local_20,(shared_ptr<Expression> *)(local_40 + 0x10),
               (shared_ptr<Expression> *)this);
  }
  std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x18));
  _Var2._M_pi = extraout_RDX_00;
LAB_0010db29:
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::term() {
    ptr<Expression> expr = factor();

    if(match(TokenType::Plus)) {
        consume();
        expr = make<BinaryOperator>(make<Addition>(), expr, term());
    } else if(match(TokenType::Minus)) {
        consume();
        expr = make<BinaryOperator>(make<Subtraction>(), expr, term());
    }

    return expr;
}